

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorTemplateBase<llvm::DWARFGdbIndex::AddressEntry,_true>::push_back
          (SmallVectorTemplateBase<llvm::DWARFGdbIndex::AddressEntry,_true> *this,AddressEntry *Elt)

{
  uint64_t *puVar1;
  void *pvVar2;
  uint64_t uVar3;
  uint uVar4;
  
  uVar4 = (this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void>).
          super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void>).
      super_SmallVectorBase.Capacity <= uVar4) {
    SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,0,0x18);
    uVar4 = (this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void>).
            super_SmallVectorBase.Size;
  }
  pvVar2 = (this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void>).
           super_SmallVectorBase.BeginX;
  *(undefined8 *)((long)pvVar2 + (ulong)uVar4 * 0x18 + 0x10) = *(undefined8 *)&Elt->CuIndex;
  uVar3 = Elt->HighAddress;
  puVar1 = (uint64_t *)((long)pvVar2 + (ulong)uVar4 * 0x18);
  *puVar1 = Elt->LowAddress;
  puVar1[1] = uVar3;
  uVar4 = (this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void>).
          super_SmallVectorBase.Size;
  if (uVar4 < (this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void>).
              super_SmallVectorBase.Capacity) {
    (this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void>).
    super_SmallVectorBase.Size = uVar4 + 1;
    return;
  }
  __assert_fail("N <= capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(reinterpret_cast<void *>(this->end()), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }